

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

unsigned_long stb_rand(void)

{
  undefined1 auVar1 [12];
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  long lVar5;
  ulong uVar6;
  unsigned_long uVar7;
  ulong uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [12];
  undefined1 auVar12 [16];
  
  if ((ulong)(uint)stb__mt_index < 0x1380) {
    uVar6 = *(ulong *)((long)stb__mt_buffer + (ulong)(uint)stb__mt_index);
    stb__mt_index = stb__mt_index + 8;
  }
  else {
    if (stb__mt_index != 0x1380) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        uVar6 = uVar6 * 0x7ff8a3ed + 0x2aa01d31;
        *(ulong *)((long)stb__mt_buffer + lVar5) = uVar6 * 0x10000 + (uVar6 >> 0x10) ^ 0x31415926;
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x1380);
    }
    lVar5 = 0;
    uVar7 = stb__mt_buffer[0];
    do {
      uVar6 = stb__mt_buffer[lVar5 + 1];
      uVar8 = 0x9908b0df;
      if ((uVar6 & 1) == 0) {
        uVar8 = 0;
      }
      stb__mt_buffer[lVar5] =
           uVar8 ^ stb__mt_buffer[lVar5 + 0x18d] ^
           (ulong)(((uint)uVar6 & 0x7ffffffe | (uint)uVar7 & 0x80000000) >> 1);
      auVar4 = _DAT_001bb950;
      lVar5 = lVar5 + 1;
      uVar7 = uVar6;
    } while (lVar5 != 0xe3);
    lVar5 = 0;
    uVar9 = (uint)stb__mt_buffer[0xe3];
    do {
      uVar2 = (uint)stb__mt_buffer[lVar5 + 0xe4];
      uVar3 = (uint)stb__mt_buffer[lVar5 + 0xe5];
      auVar11._0_4_ = uVar2 & 0x7ffffffe;
      auVar11._4_4_ = 0;
      auVar11._8_4_ = uVar3 & 0x7ffffffe;
      auVar1._4_4_ = 0;
      auVar1._0_4_ = uVar9 & 0x80000000;
      auVar1._8_4_ = uVar2 & 0x80000000;
      auVar12._0_8_ = SUB128(auVar11 | auVar1,0) >> 1;
      auVar12._8_4_ = SUB124(auVar11 | auVar1,8) >> 1;
      auVar12._12_4_ = 0;
      auVar10._0_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
      auVar10._4_4_ = (*(int *)((long)stb__mt_buffer + lVar5 * 8 + 0x724) << 0x1f) >> 0x1f;
      auVar10._8_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
      auVar10._12_4_ = (*(int *)((long)stb__mt_buffer + lVar5 * 8 + 0x72c) << 0x1f) >> 0x1f;
      *(undefined1 (*) [16])(stb__mt_buffer + lVar5 + 0xe3) =
           auVar10 & auVar4 ^ *(undefined1 (*) [16])(stb__mt_buffer + lVar5) ^ auVar12;
      lVar5 = lVar5 + 2;
      uVar9 = uVar3;
    } while (lVar5 != 0x18c);
    uVar6 = 0;
    if ((stb__mt_buffer[0] & 1) != 0) {
      uVar6 = 0x9908b0df;
    }
    stb__mt_buffer[0x26f] =
         uVar6 ^ stb__mt_buffer[0x18c] ^
         (ulong)(((uint)stb__mt_buffer[0] & 0x7ffffffe | (uint)stb__mt_buffer[0x26f] & 0x80000000)
                >> 1);
    stb__mt_index = 8;
    uVar6 = stb__mt_buffer[0];
  }
  uVar6 = uVar6 >> 0xb ^ uVar6;
  uVar6 = ((uint)uVar6 & 0x13a58ad) << 7 ^ uVar6;
  uVar6 = ((uint)uVar6 & 0x1df8c) << 0xf ^ uVar6;
  return uVar6 >> 0x12 ^ uVar6;
}

Assistant:

unsigned long stb_rand()
{
   unsigned long * b = stb__mt_buffer;
   int idx = stb__mt_index;
   unsigned long s,r;
   int i;
	
   if (idx >= STB__MT_LEN*sizeof(unsigned long)) {
      if (idx > STB__MT_LEN*sizeof(unsigned long))
         stb_srand(0);
      idx = 0;
      i = 0;
      for (; i < STB__MT_IB; i++) {
         s = STB__TWIST(b, i, i+1);
         b[i] = b[i + STB__MT_IA] ^ (s >> 1) ^ STB__MAGIC(s);
      }
      for (; i < STB__MT_LEN-1; i++) {
         s = STB__TWIST(b, i, i+1);
         b[i] = b[i - STB__MT_IB] ^ (s >> 1) ^ STB__MAGIC(s);
      }
      
      s = STB__TWIST(b, STB__MT_LEN-1, 0);
      b[STB__MT_LEN-1] = b[STB__MT_IA-1] ^ (s >> 1) ^ STB__MAGIC(s);
   }
   stb__mt_index = idx + sizeof(unsigned long);
   
   r = *(unsigned long *)((unsigned char *)b + idx);
   
   r ^= (r >> 11);
   r ^= (r << 7) & 0x9D2C5680;
   r ^= (r << 15) & 0xEFC60000;
   r ^= (r >> 18);
   
   return r;
}